

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

bool __thiscall
Js::JavascriptString::GetPropertyBuiltIns
          (JavascriptString *this,PropertyId propertyId,Var *value,ScriptContext *requestContext)

{
  RecyclableObject *pRVar1;
  
  if (propertyId == 0xd1) {
    pRVar1 = (RecyclableObject *)JavascriptNumber::ToVar(this->m_charLength,requestContext);
  }
  else {
    pRVar1 = ScriptContext::GetMissingPropertyResult(requestContext);
  }
  *value = pRVar1;
  return propertyId == 0xd1;
}

Assistant:

bool JavascriptString::GetPropertyBuiltIns(PropertyId propertyId, Var* value, ScriptContext* requestContext)
    {
        if (propertyId == PropertyIds::length)
        {
            *value = JavascriptNumber::ToVar(this->GetLength(), requestContext);
            return true;
        }

        *value = requestContext->GetMissingPropertyResult();
        return false;
    }